

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importsource.cpp
# Opt level: O0

string * __thiscall
libcellml::ImportSource::url_abi_cxx11_(string *__return_storage_ptr__,ImportSource *this)

{
  ImportSourceImpl *pIVar1;
  ImportSource *this_local;
  
  pIVar1 = pFunc(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pIVar1->mUrl);
  return __return_storage_ptr__;
}

Assistant:

std::string ImportSource::url() const
{
    return pFunc()->mUrl;
}